

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_PREDpp_2021.h
# Opt level: O2

void __thiscall PREDpp<UFPC>::PerformLabeling(PREDpp<UFPC> *this)

{
  long lVar1;
  char *pcVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Mat1b *pMVar7;
  Mat1i *pMVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int r_i;
  uint *puVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  uint *puVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  int local_9c;
  Size local_98;
  Mat local_90 [96];
  
  uVar3 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_98.height = (int)uVar3;
  local_98.width = (int)((ulong)uVar3 >> 0x20);
  local_9c = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98,&local_9c);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar3 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar3 >> 0x20) + 1) / 2) * (((int)uVar3 + 1) / 2) + 1);
  puVar18 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar5 = *(int *)&pMVar7->field_0xc;
  iVar6 = *(int *)&pMVar7->field_0x8;
  lVar26 = *(long *)&pMVar7->field_0x10;
  lVar27 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar30 = (long)iVar5 + -1;
  uVar25 = 0xffffffffffffffff;
  do {
    do {
      lVar24 = (long)(int)uVar25;
      uVar25 = lVar24 + 1;
      cVar4 = *(char *)(lVar26 + 1 + lVar24);
      iVar29 = (int)lVar30;
      if (iVar29 <= (int)uVar25) {
        if (cVar4 != '\0') {
          puVar18[UFPC::length_] = UFPC::length_;
          uVar13 = UFPC::length_;
          UFPC::length_ = UFPC::length_ + 1;
LAB_00213899:
          *(uint *)(lVar27 + uVar25 * 4) = uVar13;
        }
LAB_0021389c:
        lVar26 = 1;
        lVar27 = 0;
        do {
          if (iVar6 <= lVar26) {
            uVar13 = UFPC::Flatten();
            (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar13;
            pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
            for (lVar26 = 0; puVar18 = UFPC::P_, lVar26 < *(int *)&pMVar8->field_0x8;
                lVar26 = lVar26 + 1) {
              lVar27 = **(long **)&pMVar8->field_0x48 * lVar26 + *(long *)&pMVar8->field_0x10;
              iVar5 = *(int *)&pMVar8->field_0xc;
              for (lVar30 = 0; (long)iVar5 * 4 != lVar30; lVar30 = lVar30 + 4) {
                *(uint *)(lVar27 + lVar30) = puVar18[*(uint *)(lVar27 + lVar30)];
              }
            }
            UFPC::Dealloc();
            return;
          }
          pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
          pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
          lVar19 = *(long *)&pMVar7->field_0x10;
          lVar9 = **(long **)&pMVar7->field_0x48;
          lVar22 = lVar9 * lVar26;
          lVar24 = lVar19 + lVar22;
          pcVar20 = (char *)(lVar24 - lVar9);
          lVar10 = *(long *)&pMVar8->field_0x10;
          lVar11 = **(long **)&pMVar8->field_0x48;
          lVar28 = lVar11 * lVar26;
          puVar23 = (uint *)(lVar10 + lVar28);
          puVar18 = (uint *)((long)puVar23 - lVar11);
          if (iVar5 < 2) {
            if (*(char *)(lVar19 + lVar22) != '\0') {
              if (*pcVar20 == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar13 = UFPC::length_ + 1;
                *puVar23 = UFPC::length_;
                UFPC::length_ = uVar13;
              }
              else {
                *puVar23 = *puVar18;
              }
            }
          }
          else {
            if (*(char *)(lVar19 + lVar22) == '\0') {
              uVar25 = 0;
              goto LAB_002139ae;
            }
            if (*pcVar20 == '\0') {
              if (pcVar20[1] == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar13 = UFPC::length_ + 1;
                *puVar23 = UFPC::length_;
                UFPC::length_ = uVar13;
                iVar31 = 0;
                goto LAB_00213b98;
              }
              *puVar23 = puVar18[1];
              iVar31 = 0;
              goto LAB_00213c28;
            }
            *puVar23 = *puVar18;
            uVar25 = 0;
LAB_00213c50:
            iVar31 = (int)uVar25;
            lVar16 = (long)iVar31;
            lVar17 = lVar16 << 0x20;
            lVar21 = 0;
            while( true ) {
              iVar12 = (int)lVar21;
              if (lVar30 <= lVar16 + 1 + lVar21) {
                uVar25 = (ulong)(iVar31 + iVar12 + 1);
                if (*(char *)(lVar24 + uVar25) != '\0') {
                  if (pcVar20[uVar25] == '\0') {
                    uVar13 = *(uint *)((long)puVar23 + (lVar17 >> 0x1e));
                  }
                  else {
                    uVar13 = puVar18[uVar25];
                  }
                  puVar23[uVar25] = uVar13;
                }
                goto LAB_00213d8b;
              }
              if (*(char *)(lVar19 + lVar22 + lVar16 + 1 + lVar21) == '\0') {
                uVar25 = (ulong)(iVar31 + iVar12 + 1);
                goto LAB_002139ae;
              }
              if (*(char *)(lVar19 + 1 + lVar9 * lVar27 + lVar16 + lVar21) == '\0') break;
              *(undefined4 *)(lVar28 + lVar16 * 4 + lVar10 + 4 + lVar21 * 4) =
                   *(undefined4 *)(lVar11 * lVar27 + lVar16 * 4 + lVar10 + 4 + lVar21 * 4);
              lVar17 = lVar17 + 0x100000000;
              lVar21 = lVar21 + 1;
            }
            uVar25 = (ulong)(iVar31 + iVar12 + 1);
LAB_00213bc9:
            iVar31 = (int)uVar25;
            if (pcVar20[(long)iVar31 + 1] == '\0') {
              puVar23[iVar31] = puVar23[(long)iVar31 + -1];
              goto LAB_00213b98;
            }
            uVar13 = UFPC::Merge(puVar23[(long)iVar31 + -1],puVar18[(long)iVar31 + 1]);
            puVar23[iVar31] = uVar13;
            while( true ) {
              iVar31 = (int)uVar25;
LAB_00213c28:
              lVar16 = (long)iVar31;
              uVar25 = lVar16 + 1;
              if (iVar29 <= (int)uVar25) break;
              if (*(char *)(lVar24 + uVar25) != '\0') {
                puVar23[lVar16 + 1] = puVar18[lVar16 + 1];
                goto LAB_00213c50;
              }
LAB_002139ae:
              while( true ) {
                lVar21 = (long)(int)uVar25;
                lVar16 = lVar21 << 0x20;
                lVar17 = 0;
                do {
                  lVar14 = lVar16;
                  lVar15 = lVar14 >> 0x20;
                  if (lVar30 <= lVar21 + lVar17 + 1) {
                    uVar25 = (ulong)((int)lVar17 + (int)uVar25 + 1);
                    if (*(char *)(lVar24 + uVar25) == '\0') goto LAB_00213d8b;
                    if (pcVar20[uVar25] != '\0') {
                      uVar13 = puVar18[uVar25];
                      goto LAB_00213bc1;
                    }
                    if (pcVar20[lVar15] == '\0') {
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar13 = UFPC::length_ + 1;
                      puVar23[uVar25] = UFPC::length_;
                      UFPC::length_ = uVar13;
                      goto LAB_00213d8b;
                    }
                    uVar13 = puVar18[lVar15];
                    goto LAB_00213bc1;
                  }
                  lVar1 = lVar17 + 1;
                  pcVar2 = (char *)(lVar19 + lVar22 + lVar21 + 1 + lVar17);
                  lVar16 = lVar14 + 0x100000000;
                  lVar17 = lVar1;
                } while (*pcVar2 == '\0');
                uVar25 = (uVar25 & 0xffffffff) + lVar1;
                iVar31 = (int)uVar25;
                if (*(char *)(lVar1 + lVar9 * lVar27 + lVar21 + lVar19) != '\0') {
                  *(undefined4 *)(lVar28 + lVar21 * 4 + lVar10 + lVar1 * 4) =
                       *(undefined4 *)(lVar11 * lVar27 + lVar21 * 4 + lVar10 + lVar1 * 4);
                  goto LAB_00213c50;
                }
                lVar16 = lVar14 + 0x200000000 >> 0x20;
                if (pcVar20[lVar16] != '\0') break;
                if (pcVar20[lVar15] == '\0') {
                  UFPC::P_[UFPC::length_] = UFPC::length_;
                  uVar13 = UFPC::length_ + 1;
                  *(uint *)(lVar28 + lVar21 * 4 + lVar10 + lVar1 * 4) = UFPC::length_;
                  UFPC::length_ = uVar13;
                }
                else {
                  *(uint *)(lVar28 + lVar21 * 4 + lVar10 + lVar1 * 4) = puVar18[lVar15];
                }
LAB_00213b98:
                uVar25 = (long)iVar31 + 1;
                if (iVar29 <= (int)uVar25) {
                  uVar25 = uVar25 & 0xffffffff;
                  if (*(char *)(lVar24 + uVar25) != '\0') {
                    uVar13 = puVar23[iVar31];
LAB_00213bc1:
                    puVar23[uVar25] = uVar13;
                  }
                  goto LAB_00213d8b;
                }
                if (*(char *)(lVar24 + uVar25) != '\0') goto LAB_00213bc9;
              }
              if (pcVar20[lVar15] == '\0') {
                *(uint *)(lVar28 + lVar21 * 4 + lVar10 + lVar1 * 4) = puVar18[lVar16];
              }
              else {
                uVar13 = UFPC::Merge(puVar18[lVar16],puVar18[lVar15]);
                *(uint *)(lVar28 + lVar21 * 4 + lVar10 + lVar1 * 4) = uVar13;
              }
            }
            uVar25 = uVar25 & 0xffffffff;
            if (*(char *)(lVar24 + uVar25) != '\0') {
              puVar23[uVar25] = puVar18[uVar25];
            }
          }
LAB_00213d8b:
          lVar26 = lVar26 + 1;
          lVar27 = lVar27 + 1;
        } while( true );
      }
    } while (cVar4 == '\0');
    puVar18[UFPC::length_] = UFPC::length_;
    uVar13 = UFPC::length_ + 1;
    *(uint *)(lVar27 + 4 + lVar24 * 4) = UFPC::length_;
    UFPC::length_ = uVar13;
    lVar19 = lVar24 << 0x20;
    uVar25 = lVar24 + 2;
    lVar24 = lVar19 + 0x200000000;
    while( true ) {
      lVar19 = lVar19 + 0x100000000;
      if (lVar30 <= (long)uVar25) {
        uVar25 = lVar24 >> 0x20;
        if (*(char *)(lVar26 + uVar25) == '\0') goto LAB_0021389c;
        uVar13 = *(uint *)(lVar27 + (lVar19 >> 0x1e));
        goto LAB_00213899;
      }
      if (*(char *)(lVar26 + uVar25) == '\0') break;
      *(undefined4 *)(lVar27 + uVar25 * 4) = *(undefined4 *)(lVar27 + -4 + uVar25 * 4);
      uVar25 = uVar25 + 1;
      lVar24 = lVar24 + 0x100000000;
    }
    uVar25 = uVar25 & 0xffffffff;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        //Conditions:
#define CONDITION_P img_row11[c - 1] > 0
#define CONDITION_Q img_row11[c] > 0
#define CONDITION_R img_row11[c + 1] > 0
#define CONDITION_S img_row00[c - 1] > 0
#define CONDITION_X img_row00[c] > 0


//Actions:
// Action 1: nothing
#define ACTION_1 
// Action 2: x<-newlabel
#define ACTION_2 img_labels_row00[c] = LabelsSolver::NewLabel();
// Action 3: x<-p
#define ACTION_3 img_labels_row00[c] = img_labels_row11[c - 1];
// Action 4: x<-q
#define ACTION_4 img_labels_row00[c] = img_labels_row11[c];
// Action 5: x<-r
#define ACTION_5 img_labels_row00[c] = img_labels_row11[c + 1];
// Action 6: x<-p+r
#define ACTION_6 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row11[c + 1], img_labels_row11[c - 1]);
// Action 7: x<-s
#define ACTION_7 img_labels_row00[c] = img_labels_row00[c - 1];
// Action 8: x<-r+s
#define ACTION_8 img_labels_row00[c] = LabelsSolver::Merge(img_labels_row00[c - 1], img_labels_row11[c + 1]);


#define COLS w

        {
            int c = -1;

            const unsigned char* const img_row00 = img_.ptr<unsigned char>(0);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(0);
            goto fl_tree_0;
#include "labeling_PREDpp_2021_fl_forest.inc.h"
        }

        for (int r = 1; r < h; ++r) {
            int c = -1;
            // Get rows pointer
    // Row pointers for the input image 
            const unsigned char* const img_row00 = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row11 = (unsigned char *)(((char *)img_row00) + img_.step.p[0] * -1);

            // Row pointers for the output image 
            unsigned* const img_labels_row00 = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row11 = (unsigned *)(((char *)img_labels_row00) + img_labels_.step.p[0] * -1);
            goto cl_tree_0;
#include "labeling_PREDpp_2021_cl_forest.inc.h"

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }